

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void update_bitmap_after_coalescing(gen_ctx_t gen_ctx,bitmap_t bm)

{
  bitmap_t nb;
  ulong *puVar1;
  void **ppvVar2;
  VARR_MIR_reg_t *pVVar3;
  ra_ctx *prVar4;
  VARR_reg_info_t *pVVar5;
  VARR_allocno_info_t *pVVar6;
  allocno_info_t *paVar7;
  VARR_bitmap_t *pVVar8;
  gen_ctx *pgVar9;
  gen_ctx *pgVar10;
  VARR_bitmap_t *pVVar11;
  VARR_live_range_t *pVVar12;
  VARR_lr_gap_t *pVVar13;
  lr_gap_t *plVar14;
  FILE *pFVar15;
  MIR_item_t_conflict pMVar16;
  bitmap_t bm_00;
  bool bVar17;
  byte bVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  MIR_type_t MVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  char *pcVar27;
  ulong uVar28;
  MIR_reg_t *pMVar29;
  char *pcVar30;
  ulong uVar31;
  allocno_info_t *paVar32;
  bitmap_el_t *pbVar33;
  bitmap_t *ppVVar34;
  FILE *pFVar35;
  live_range_t_conflict plVar36;
  lr_gap_t *plVar37;
  bitmap_t pVVar38;
  short sVar39;
  uint uVar40;
  gen_ctx_t pgVar41;
  gen_ctx_t pgVar42;
  MIR_item_t pMVar43;
  uint uVar44;
  MIR_reg_t reg;
  uint uVar45;
  bitmap_t unaff_RBP;
  gen_ctx_t pgVar46;
  ulong uVar47;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t in_R8;
  char cVar48;
  uint uVar49;
  lr_bb_t_conflict plVar50;
  gen_ctx_t pgVar51;
  long lVar52;
  gen_ctx_t pgVar53;
  uint uVar54;
  gen_ctx_t unaff_R15;
  size_t sVar55;
  bool bVar56;
  lr_gap_t el;
  lr_gap_t el_00;
  lr_gap_t el_01;
  lr_gap_t el_02;
  ulong in_stack_fffffffffffffe90;
  undefined1 auStack_160 [56];
  gen_ctx_t pgStack_128;
  gen_ctx_t pgStack_120;
  uint uStack_118;
  int iStack_114;
  MIR_func_t pMStack_110;
  gen_ctx_t pgStack_108;
  bitmap_t pVStack_100;
  gen_ctx_t pgStack_f8;
  int iStack_f0;
  MIR_reg_t MStack_ec;
  gen_ctx_t pgStack_e8;
  bitmap_t pVStack_e0;
  bitmap_t pVStack_d8;
  gen_ctx_t pgStack_d0;
  bitmap_t pVStack_c8;
  bitmap_t pVStack_c0;
  bitmap_t pVStack_b8;
  undefined1 auStack_b0 [16];
  MIR_item_t pMStack_a0;
  FILE *pFStack_98;
  gen_ctx_t pgStack_90;
  undefined1 auStack_88 [40];
  VARR_void_ptr_t *pVStack_60;
  gen_ctx_t pgStack_58;
  gen_ctx_t pgStack_50;
  gen_ctx_t pgStack_48;
  bitmap_t pVStack_40;
  
  if (bm != (bitmap_t)0x0) {
    gen_ctx_00 = gen_ctx;
    pgVar51 = (gen_ctx_t)0x0;
    do {
      uVar47 = (ulong)pgVar51 >> 6;
      uVar28 = bm->els_num;
      bVar56 = true;
      pgVar46 = pgVar51;
      if (uVar47 < uVar28) {
        gen_ctx_00 = (gen_ctx_t)(uVar28 << 6);
LAB_0016d02f:
        in_R8 = (gen_ctx_t)bm->varr[uVar47];
        if ((in_R8 == (gen_ctx_t)0x0) ||
           (in_R8 = (gen_ctx_t)((ulong)in_R8 >> ((ulong)pgVar51 & 0x3f)), in_R8 == (gen_ctx_t)0x0))
        goto LAB_0016d042;
        uVar47 = (ulong)in_R8 & 1;
        unaff_R15 = pgVar51;
        while (uVar47 == 0) {
          unaff_R15 = (gen_ctx_t)((long)&unaff_R15->ctx + 1);
          uVar47 = (ulong)in_R8 & 2;
          in_R8 = (gen_ctx_t)((ulong)in_R8 >> 1);
        }
        bVar56 = false;
        pgVar46 = (gen_ctx_t)((long)&unaff_R15->ctx + 1);
      }
LAB_0016d076:
      if (bVar56) {
        return;
      }
      if (0x21 < (uint)unaff_R15) {
        pVVar3 = gen_ctx->coalesce_ctx->first_coalesced_reg;
        if (((pVVar3 == (VARR_MIR_reg_t *)0x0) ||
            (gen_ctx_00 = (gen_ctx_t)pVVar3->varr, gen_ctx_00 == (gen_ctx_t)0x0)) ||
           (uVar47 = (ulong)unaff_R15 & 0xffffffff, pVVar3->els_num <= uVar47)) {
          pVStack_40 = (bitmap_t)assign;
          update_bitmap_after_coalescing_cold_1();
          pVStack_60 = (VARR_void_ptr_t *)&DAT_00000001;
          pgVar51 = (gen_ctx_t)gen_ctx_00->ctx;
          uVar45 = gen_ctx_00->curr_cfg->max_var;
          pMStack_110 = (gen_ctx_00->curr_func_item->u).func;
          pgStack_90 = pgVar51;
          auStack_88._32_8_ = bm;
          pgStack_58 = pgVar46;
          pgStack_50 = gen_ctx;
          pgStack_48 = unaff_R15;
          pVStack_40 = unaff_RBP;
          pcVar27 = (char *)_MIR_get_module_global_var_hard_regs
                                      ((MIR_context_t)pgVar51,gen_ctx_00->curr_func_item->module);
          auStack_160._36_4_ = gen_ctx_00->optimize_level;
          prVar4 = gen_ctx_00->ra_ctx;
          pgVar46 = (gen_ctx_t)prVar4->conflict_locs1;
          pVStack_c8 = gen_ctx_00->temp_bitmap2;
          gen_ctx_00->func_stack_slots_num = 0;
          pVVar5 = gen_ctx_00->curr_cfg->reg_info;
          if (pVVar5 == (VARR_reg_info_t *)0x0) goto LAB_0016eeac;
          prVar4->curr_reg_infos = pVVar5->varr;
          pVVar3 = prVar4->reg_renumber;
          auStack_160._48_8_ = pcVar27;
          pgStack_d0 = pgVar46;
          if ((pVVar3 == (VARR_MIR_reg_t *)0x0) || (pVVar3->varr == (MIR_reg_t *)0x0))
          goto LAB_0016ee84;
          pVVar3->els_num = 0;
          uVar44 = 0;
          goto LAB_0016d1c6;
        }
        uVar45 = *(uint *)((long)gen_ctx_00->call_used_hard_regs + uVar47 * 4 + -0x68);
        unaff_RBP = (bitmap_t)(ulong)uVar45;
        if (uVar45 != (uint)unaff_R15) {
          if (uVar47 < uVar28 << 6) {
            bVar18 = (byte)unaff_R15 & 0x3f;
            puVar1 = bm->varr + ((ulong)unaff_R15 >> 6 & 0x3ffffff);
            *puVar1 = *puVar1 & (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
          }
          pVStack_40 = (bitmap_t)0x16d0d2;
          gen_ctx_00 = (gen_ctx_t)bm;
          bitmap_expand(bm,(size_t)((long)&unaff_RBP->els_num + 1));
          bm->varr[uVar45 >> 6] = bm->varr[uVar45 >> 6] | 1L << ((ulong)unaff_RBP & 0x3f);
        }
      }
      pgVar51 = pgVar46;
    } while (bm != (bitmap_t)0x0);
  }
  pVStack_40 = (bitmap_t)0x16d0f2;
  update_bitmap_after_coalescing_cold_2();
  return;
LAB_0016d042:
  uVar47 = uVar47 + 1;
  pgVar51 = (gen_ctx_t)(uVar47 * 0x40);
  pgVar46 = gen_ctx_00;
  if (uVar28 == uVar47) goto LAB_0016d076;
  goto LAB_0016d02f;
  while( true ) {
    uVar28 = pVVar3->els_num + 1;
    if (pVVar3->size < uVar28) {
      sVar55 = (uVar28 >> 1) + uVar28;
      pcVar27 = (char *)(sVar55 * 4);
      pMVar29 = (MIR_reg_t *)realloc(pgVar51,(size_t)pcVar27);
      pVVar3->varr = pMVar29;
      pVVar3->size = sVar55;
    }
    sVar55 = pVVar3->els_num;
    pVVar3->els_num = sVar55 + 1;
    pVVar3->varr[sVar55] = 0xffffffff;
    uVar44 = uVar44 + 1;
    if (uVar45 < uVar44) break;
LAB_0016d1c6:
    pVVar3 = gen_ctx_00->ra_ctx->reg_renumber;
    pgVar51 = (gen_ctx_t)pVVar3->varr;
    if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016ed9f;
  }
  prVar4 = gen_ctx_00->ra_ctx;
  pVVar6 = prVar4->sorted_regs;
  if ((pVVar6 == (VARR_allocno_info_t *)0x0) || (pVVar6->varr == (allocno_info_t *)0x0)) {
LAB_0016ee89:
    assign_cold_63();
    goto LAB_0016ee8e;
  }
  pVVar6->els_num = 0;
  pVStack_d8 = (bitmap_t)prVar4->curr_reg_infos;
  prVar4->start_mem_loc = 0x22;
  uVar44 = auStack_160._0_4_;
  if (0x21 < uVar45) {
    uVar54 = 0x22;
    do {
      pVVar38 = gen_ctx_00->tied_regs;
      if (pVVar38 == (bitmap_t)0x0) goto LAB_0016edb3;
      uVar28 = (ulong)uVar54;
      if (uVar28 < pVVar38->els_num << 6) {
        uVar47 = (pVVar38->varr[uVar54 >> 6] >> (uVar28 & 0x3f) & 1) << 0x20;
      }
      else {
        uVar47 = 0;
      }
      pVVar38 = gen_ctx_00->addr_regs;
      if (pVVar38 == (bitmap_t)0x0) goto LAB_0016edbf;
      if ((uVar28 < pVVar38->els_num << 6) &&
         ((pVVar38->varr[uVar54 >> 6] >> (uVar28 & 0x3f) & 1) != 0)) {
        pgVar51 = (gen_ctx_t)gen_ctx_00->ctx;
        auStack_160._16_4_ = uVar54 - 0x21;
        MVar23 = MIR_reg_type((MIR_context_t)pgVar51,uVar54 - 0x21,pMStack_110);
        pcVar27 = (char *)gen_ctx_00->func_stack_slots_num;
        uVar24 = 0;
        uVar40 = 1;
        do {
          in_R8 = (gen_ctx_t)CONCAT71((int7)((ulong)in_R8 >> 8),MVar23 == MIR_T_LD);
          uVar49 = (uint)pcVar27 + 0x22;
          bVar56 = uVar24 != 0;
          uVar44 = ((uint)pcVar27 < 0xffffffde && MVar23 == MIR_T_LD) + 1;
          if (bVar56) {
            uVar49 = (uint)pgVar51;
            uVar44 = uVar40;
          }
          uVar24 = 2;
          if (!bVar56) {
            uVar24 = (uint)((uVar49 - 0x22) % uVar44 == 0);
          }
          pcVar27 = (char *)((long)&((gen_ctx_t)pcVar27)->ctx + 1);
          pgVar51 = (gen_ctx_t)(ulong)uVar49;
          uVar40 = uVar44;
        } while (uVar24 < uVar44);
        gen_ctx_00->func_stack_slots_num = (size_t)pcVar27;
        prVar4 = gen_ctx_00->ra_ctx;
        pVVar3 = prVar4->reg_renumber;
        if (((pVVar3 == (VARR_MIR_reg_t *)0x0) || (pVVar3->varr == (MIR_reg_t *)0x0)) ||
           (pVVar3->els_num <= uVar28)) goto LAB_0016edd0;
        pVVar3->varr[uVar28] = uVar49;
        prVar4->start_mem_loc = uVar44 + uVar49;
        pgVar46 = (gen_ctx_t)gen_ctx_00->debug_file;
        if ((pgVar46 != (gen_ctx_t)0x0) && (1 < gen_ctx_00->debug_level)) {
          pcVar30 = MIR_reg_name(gen_ctx_00->ctx,auStack_160._16_4_,pMStack_110);
          in_R8 = (gen_ctx_t)gen_ctx_00->ra_ctx->curr_reg_infos[uVar28].freq;
          pcVar27 = " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n";
          fprintf((FILE *)pgVar46," Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                  pcVar30,uVar28,in_R8,(ulong)uVar49);
          pgVar51 = pgVar46;
        }
      }
      else {
        pVVar6 = gen_ctx_00->ra_ctx->sorted_regs;
        pgVar51 = (gen_ctx_t)pVVar6->varr;
        if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016eddc;
        uVar31 = pVVar6->els_num + 1;
        if (pVVar6->size < uVar31) {
          sVar55 = (uVar31 >> 1) + uVar31;
          pcVar27 = (char *)(sVar55 * 0x10);
          paVar32 = (allocno_info_t *)realloc(pgVar51,(size_t)pcVar27);
          pVVar6->varr = paVar32;
          pVVar6->size = sVar55;
        }
        sVar55 = pVVar6->els_num;
        paVar7 = pVVar6->varr;
        pVVar6->els_num = sVar55 + 1;
        paVar32 = paVar7 + sVar55;
        paVar32->reg = (int)(uVar47 | uVar28);
        paVar32->tied_reg_p = (int)((uVar47 | uVar28) >> 0x20);
        paVar7[sVar55].reg_infos = (reg_info_t *)pVStack_d8;
        pVVar12 = gen_ctx_00->lr_ctx->var_live_ranges;
        if (((pVVar12 == (VARR_live_range_t *)0x0) ||
            (pVVar12->varr == (live_range_t_conflict *)0x0)) || (pVVar12->els_num <= uVar28))
        goto LAB_0016ed93;
        sVar55 = 0;
        for (plVar36 = pVVar12->varr[uVar28]; plVar36 != (live_range_t_conflict)0x0;
            plVar36 = plVar36->next) {
          sVar55 = sVar55 + (long)((plVar36->finish - plVar36->start) + 1);
        }
        gen_ctx_00->ra_ctx->curr_reg_infos[uVar28].live_length = sVar55;
      }
      uVar54 = uVar54 + 1;
    } while (uVar54 <= uVar45);
  }
  pgVar46 = (gen_ctx_t)auStack_160._48_8_;
  auStack_160._0_4_ = uVar44;
  if (-1 < gen_ctx_00->lr_ctx->curr_point) {
    uVar28 = 0;
    do {
      prVar4 = gen_ctx_00->ra_ctx;
      pVVar8 = prVar4->used_locs;
      if (pVVar8 == (VARR_bitmap_t *)0x0) goto LAB_0016edfc;
      uVar47 = pVVar8->els_num;
      pcVar27 = (char *)(long)(int)uVar47;
      if ((long)pcVar27 <= (long)uVar28) break;
      ppVVar34 = pVVar8->varr;
      bVar56 = ppVVar34 != (bitmap_t *)0x0;
      pcVar27 = (char *)CONCAT71((int7)(int3)(uVar47 >> 8),bVar56);
      if (pgVar46 == (gen_ctx_t)0x0) {
        if (uVar47 <= uVar28 || !bVar56) goto LAB_0016ee51;
        pVVar38 = ppVVar34[uVar28];
        if ((pVVar38 == (bitmap_t)0x0) || (pVVar38->varr == (bitmap_el_t *)0x0)) goto LAB_0016ee10;
        pVVar38->els_num = 0;
        if (1 < (uint)auStack_160._36_4_) {
          pVVar8 = prVar4->busy_used_locs;
          if (((pVVar8 != (VARR_bitmap_t *)0x0) && (pVVar8->varr != (bitmap_t *)0x0)) &&
             (uVar28 < pVVar8->els_num)) {
            pVVar38 = pVVar8->varr[uVar28];
            if ((pVVar38 != (bitmap_t)0x0) && (pVVar38->varr != (bitmap_el_t *)0x0)) {
              pVVar38->els_num = 0;
              goto LAB_0016d78f;
            }
            goto LAB_0016ee4c;
          }
          goto LAB_0016ee29;
        }
      }
      else {
        if (uVar47 <= uVar28 || !bVar56) goto LAB_0016ee24;
        pVVar38 = ppVVar34[uVar28];
        if (pVVar38 == (bitmap_t)0x0) goto LAB_0016ee1f;
        pgVar9 = (gen_ctx *)pVVar38->els_num;
        pgVar10 = (gen_ctx *)pgVar46->ctx;
        if (pgVar10 <= pgVar9) {
          if (pVVar38->varr != (bitmap_el_t *)0x0) {
            pVVar38->els_num = (size_t)pgVar10;
            goto LAB_0016d695;
          }
          assign_cold_7();
LAB_0016ee7a:
          assign_cold_10();
LAB_0016ee7f:
          assign_cold_38();
LAB_0016ee84:
          assign_cold_65();
          goto LAB_0016ee89;
        }
        lVar52 = (long)((ulong)pgVar10 & 0x3ffffffffffffff) - (long)pgVar9;
        if (pgVar9 <= (gen_ctx *)((ulong)pgVar10 & 0x3ffffffffffffff) && lVar52 != 0) {
          do {
            if (pVVar38->varr == (bitmap_el_t *)0x0) goto LAB_0016ed70;
            uVar47 = pVVar38->els_num + 1;
            if (pVVar38->size < uVar47) {
              sVar55 = (uVar47 >> 1) + uVar47;
              pbVar33 = (bitmap_el_t *)realloc(pVVar38->varr,sVar55 * 8);
              pVVar38->varr = pbVar33;
              pVVar38->size = sVar55;
              pgVar46 = (gen_ctx_t)auStack_160._48_8_;
            }
            sVar55 = pVVar38->els_num;
            pVVar38->els_num = sVar55 + 1;
            pVVar38->varr[sVar55] = 0;
            lVar52 = lVar52 + -1;
          } while (lVar52 != 0);
        }
LAB_0016d695:
        pgVar51 = (gen_ctx_t)pVVar38->varr;
        pcVar27 = (char *)pgVar46->curr_func_item;
        memcpy(pgVar51,pcVar27,(long)pgVar10 << 3);
        if (1 < (uint)auStack_160._36_4_) {
          pVVar8 = gen_ctx_00->ra_ctx->busy_used_locs;
          if (((pVVar8 != (VARR_bitmap_t *)0x0) && (pVVar8->varr != (bitmap_t *)0x0)) &&
             (uVar28 < pVVar8->els_num)) {
            pVVar38 = pVVar8->varr[uVar28];
            if (pVVar38 == (bitmap_t)0x0) goto LAB_0016ee7a;
            pgVar9 = (gen_ctx *)pVVar38->els_num;
            pgVar10 = (gen_ctx *)pgVar46->ctx;
            if (pgVar9 < pgVar10) {
              lVar52 = (long)((ulong)pgVar10 & 0x3ffffffffffffff) - (long)pgVar9;
              if (pgVar9 <= (gen_ctx *)((ulong)pgVar10 & 0x3ffffffffffffff) && lVar52 != 0) {
                do {
                  if (pVVar38->varr == (bitmap_el_t *)0x0) goto LAB_0016eda4;
                  uVar47 = pVVar38->els_num + 1;
                  if (pVVar38->size < uVar47) {
                    sVar55 = (uVar47 >> 1) + uVar47;
                    pbVar33 = (bitmap_el_t *)realloc(pVVar38->varr,sVar55 * 8);
                    pVVar38->varr = pbVar33;
                    pVVar38->size = sVar55;
                    pgVar46 = (gen_ctx_t)auStack_160._48_8_;
                  }
                  sVar55 = pVVar38->els_num;
                  pVVar38->els_num = sVar55 + 1;
                  pVVar38->varr[sVar55] = 0;
                  lVar52 = lVar52 + -1;
                } while (lVar52 != 0);
              }
            }
            else {
              if (pVVar38->varr == (bitmap_el_t *)0x0) goto LAB_0016ee9d;
              pVVar38->els_num = (size_t)pgVar10;
            }
            pgVar51 = (gen_ctx_t)pVVar38->varr;
            pcVar27 = (char *)pgVar46->curr_func_item;
            memcpy(pgVar51,pcVar27,(long)pgVar10 << 3);
            goto LAB_0016d78f;
          }
          goto LAB_0016ee01;
        }
      }
LAB_0016d78f:
      bVar56 = (long)uVar28 < (long)gen_ctx_00->lr_ctx->curr_point;
      uVar28 = uVar28 + 1;
    } while (bVar56);
  }
LAB_0016d9e1:
  pVVar8 = gen_ctx_00->ra_ctx->used_locs;
  if (pVVar8 != (VARR_bitmap_t *)0x0) {
    if (gen_ctx_00->lr_ctx->curr_point < (int)pVVar8->els_num) {
      pVVar6 = gen_ctx_00->ra_ctx->sorted_regs;
      if (pVVar6 == (VARR_allocno_info_t *)0x0) goto LAB_0016eeb1;
      pVStack_e0 = (bitmap_t)pVVar6->els_num;
      pgVar51 = (gen_ctx_t)pVVar6->varr;
      pcVar27 = (char *)(long)(int)pVStack_e0;
      qsort(pgVar51,(size_t)pcVar27,0x10,allocno_info_compare_func);
      pVVar8 = gen_ctx_00->ra_ctx->used_locs;
      if (pVVar8 == (VARR_bitmap_t *)0x0) goto LAB_0016eeb6;
      pVVar11 = gen_ctx_00->ra_ctx->busy_used_locs;
      if (pVVar11 == (VARR_bitmap_t *)0x0) goto LAB_0016eebb;
      auStack_160._48_8_ = pVVar8->varr;
      pVStack_d8 = (bitmap_t)pVVar11->varr;
      uVar28 = 0;
      goto LAB_0016da79;
    }
    pVVar38 = (bitmap_t)malloc(0x18);
    pVVar38->els_num = 0;
    pVVar38->size = 1;
    pbVar33 = (bitmap_el_t *)malloc(8);
    pVVar38->varr = pbVar33;
    if (pgVar46 != (gen_ctx_t)0x0) {
      pgVar9 = (gen_ctx *)pgVar46->ctx;
      if (pgVar9 == (gen_ctx *)0x0) {
        if (pbVar33 == (bitmap_el_t *)0x0) goto LAB_0016ee47;
        pVVar38->els_num = 0;
      }
      else {
        for (uVar28 = (ulong)pgVar9 & 0x3ffffffffffffff; uVar28 != 0; uVar28 = uVar28 - 1) {
          if (pVVar38->varr == (bitmap_el_t *)0x0) goto LAB_0016ed57;
          uVar47 = pVVar38->els_num + 1;
          if (pVVar38->size < uVar47) {
            sVar55 = (uVar47 >> 1) + uVar47;
            pbVar33 = (bitmap_el_t *)realloc(pVVar38->varr,sVar55 * 8);
            pVVar38->varr = pbVar33;
            pVVar38->size = sVar55;
          }
          sVar55 = pVVar38->els_num;
          pVVar38->els_num = sVar55 + 1;
          pVVar38->varr[sVar55] = 0;
        }
      }
      pcVar27 = (char *)pgVar46->curr_func_item;
      memcpy(pVVar38->varr,pcVar27,(long)pgVar9 << 3);
    }
    pVVar8 = gen_ctx_00->ra_ctx->used_locs;
    pgVar51 = (gen_ctx_t)pVVar8->varr;
    if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016edcb;
    uVar28 = pVVar8->els_num + 1;
    if (pVVar8->size < uVar28) {
      sVar55 = (uVar28 >> 1) + uVar28;
      pcVar27 = (char *)(sVar55 * 8);
      ppVVar34 = (bitmap_t *)realloc(pgVar51,(size_t)pcVar27);
      pVVar8->varr = ppVVar34;
      pVVar8->size = sVar55;
    }
    sVar55 = pVVar8->els_num;
    pVVar8->els_num = sVar55 + 1;
    pVVar8->varr[sVar55] = pVVar38;
    if (1 < (uint)auStack_160._36_4_) {
      pVVar38 = (bitmap_t)malloc(0x18);
      pVVar38->els_num = 0;
      pVVar38->size = 1;
      pgVar51 = (gen_ctx_t)0x8;
      pbVar33 = (bitmap_el_t *)malloc(8);
      pVVar38->varr = pbVar33;
      if (pgVar46 != (gen_ctx_t)0x0) {
        pgVar9 = (gen_ctx *)pgVar46->ctx;
        if (pgVar9 == (gen_ctx *)0x0) {
          if (pbVar33 == (bitmap_el_t *)0x0) goto LAB_0016ee93;
          pVVar38->els_num = 0;
        }
        else {
          for (uVar28 = (ulong)pgVar9 & 0x3ffffffffffffff; uVar28 != 0; uVar28 = uVar28 - 1) {
            if (pVVar38->varr == (bitmap_el_t *)0x0) goto LAB_0016ed61;
            uVar47 = pVVar38->els_num + 1;
            if (pVVar38->size < uVar47) {
              sVar55 = (uVar47 >> 1) + uVar47;
              pbVar33 = (bitmap_el_t *)realloc(pVVar38->varr,sVar55 * 8);
              pVVar38->varr = pbVar33;
              pVVar38->size = sVar55;
            }
            sVar55 = pVVar38->els_num;
            pVVar38->els_num = sVar55 + 1;
            pVVar38->varr[sVar55] = 0;
          }
        }
        pcVar27 = (char *)pgVar46->curr_func_item;
        memcpy(pVVar38->varr,pcVar27,(long)pgVar9 << 3);
      }
      pVVar8 = gen_ctx_00->ra_ctx->busy_used_locs;
      pgVar51 = (gen_ctx_t)pVVar8->varr;
      if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016ee0b;
      uVar28 = pVVar8->els_num + 1;
      if (pVVar8->size < uVar28) {
        sVar55 = (uVar28 >> 1) + uVar28;
        pcVar27 = (char *)(sVar55 * 8);
        ppVVar34 = (bitmap_t *)realloc(pgVar51,(size_t)pcVar27);
        pVVar8->varr = ppVVar34;
        pVVar8->size = sVar55;
      }
      sVar55 = pVVar8->els_num;
      pVVar8->els_num = sVar55 + 1;
      pVVar8->varr[sVar55] = pVVar38;
    }
    goto LAB_0016d9e1;
  }
  goto LAB_0016edae;
  while( true ) {
    plVar36 = pVVar12->varr[uVar28];
    if (plVar36 != (live_range_t_conflict)0x0) {
      pgVar46 = (gen_ctx_t)(uVar28 + 1);
      uVar47 = 1L << (uVar28 & 0x3f);
      do {
        if (plVar36->start <= plVar36->finish) {
          lVar52 = (long)plVar36->start + -1;
          do {
            pgVar41 = (gen_ctx_t)((MIR_item_t_conflict *)(auStack_160._48_8_ + 0x68))[lVar52 + -0xc]
            ;
            pcVar27 = (char *)pgVar46;
            pgVar51 = pgVar41;
            bitmap_expand((bitmap_t)pgVar41,(size_t)pgVar46);
            if (pgVar41 == (gen_ctx_t)0x0) goto LAB_0016ecc9;
            pMVar43 = ((DLIST_LINK_MIR_item_t *)&pgVar41->curr_func_item)->prev;
            pMVar43->data = (void *)((ulong)pMVar43->data | uVar47);
            if (1 < (uint)auStack_160._36_4_) {
              pgVar41 = (gen_ctx_t)(&pVStack_d8->size)[lVar52];
              pcVar27 = (char *)pgVar46;
              pgVar51 = pgVar41;
              bitmap_expand((bitmap_t)pgVar41,(size_t)pgVar46);
              if (pgVar41 == (gen_ctx_t)0x0) goto LAB_0016ecce;
              pMVar43 = ((DLIST_LINK_MIR_item_t *)&pgVar41->curr_func_item)->prev;
              pMVar43->data = (void *)((ulong)pMVar43->data | uVar47);
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < plVar36->finish);
        }
        plVar36 = plVar36->next;
      } while (plVar36 != (live_range_t)0x0);
    }
    uVar28 = uVar28 + 1;
    if (uVar28 == 0x22) break;
LAB_0016da79:
    pVVar12 = gen_ctx_00->lr_ctx->var_live_ranges;
    if (((pVVar12 == (VARR_live_range_t *)0x0) || (pVVar12->varr == (live_range_t_conflict *)0x0))
       || (pVVar12->els_num <= uVar28)) goto LAB_0016ed5c;
  }
  pVVar38 = gen_ctx_00->func_used_hard_regs;
  if ((pVVar38 != (bitmap_t)0x0) && (pVVar38->varr != (bitmap_el_t *)0x0)) {
    pVVar38->els_num = 0;
    if (1 < (uint)auStack_160._36_4_) {
      HTAB_lr_gap_t_clear(gen_ctx_00->ra_ctx->lr_gap_tab);
    }
    if (0 < (int)(uint)pVStack_e0) {
      pVStack_e0 = (bitmap_t)(ulong)((uint)pVStack_e0 & 0x7fffffff);
      pVVar38 = (bitmap_t)0x0;
      do {
        pVVar6 = gen_ctx_00->ra_ctx->sorted_regs;
        if (((pVVar6 == (VARR_allocno_info_t *)0x0) || (pVVar6->varr == (allocno_info_t *)0x0)) ||
           ((bitmap_t)pVVar6->els_num <= pVVar38)) goto LAB_0016ed66;
        pVVar3 = gen_ctx_00->ra_ctx->reg_renumber;
        if ((pVVar3 == (VARR_MIR_reg_t *)0x0) || (pVVar3->varr == (MIR_reg_t *)0x0))
        goto LAB_0016ed6b;
        pgStack_108 = *(gen_ctx_t *)(pVVar6->varr + (long)pVVar38);
        pFVar35 = (FILE *)((ulong)pgStack_108 & 0xffffffff);
        if ((FILE *)pVVar3->els_num <= pFVar35) goto LAB_0016ed6b;
        auStack_160._24_8_ = pFVar35;
        pVStack_b8 = pVVar38;
        if (pVVar3->varr[(long)pFVar35] == 0xffffffff) {
          pgVar51 = (gen_ctx_t)gen_ctx_00->ctx;
          reg = (int)pgStack_108 - 0x21;
          auStack_160._8_4_ = MIR_reg_type((MIR_context_t)pgVar51,reg,pMStack_110);
          pgVar41 = pgStack_90;
          pgVar46 = pgStack_d0;
          uVar20 = auStack_160._48_8_;
          pVVar6 = gen_ctx_00->ra_ctx->sorted_regs;
          if (((pVVar6 == (VARR_allocno_info_t *)0x0) || (pVVar6->varr == (allocno_info_t *)0x0)) ||
             ((bitmap_t)pVVar6->els_num <= pVStack_b8)) goto LAB_0016eda9;
          if (pVVar6->varr[(long)pVVar38].tied_reg_p == 0) {
            pVVar12 = gen_ctx_00->lr_ctx->var_live_ranges;
            if (((pVVar12 == (VARR_live_range_t *)0x0) ||
                (pVVar12->varr == (live_range_t_conflict *)0x0)) ||
               ((FILE *)pVVar12->els_num <= (ulong)auStack_160._24_8_)) goto LAB_0016edf2;
            pgVar41 = (gen_ctx_t)pVVar12->varr[auStack_160._24_8_];
            if (pgVar41 != (gen_ctx_t)0x0) {
              if ((pgStack_d0 == (gen_ctx_t)0x0) || (pgStack_d0->curr_func_item == (MIR_item_t)0x0))
              goto LAB_0016ee42;
              pgStack_d0->ctx = (MIR_context_t)0x0;
              pgStack_e8 = pgVar41;
              do {
                if ((int)pgVar41->optimize_level <= *(int *)&pgVar41->field_0xc) {
                  lVar52 = (long)(int)pgVar41->optimize_level + -1;
                  do {
                    pgVar51 = pgVar46;
                    bitmap_ior((bitmap_t)pgVar46,(bitmap_t)pgVar46,
                               (bitmap_t)((MIR_item_t_conflict *)(uVar20 + 0x68))[lVar52 + -0xc]);
                    lVar52 = lVar52 + 1;
                  } while (lVar52 < *(int *)&pgVar41->field_0xc);
                }
                pgVar41 = (gen_ctx_t)pgVar41->debug_file;
              } while (pgVar41 != (gen_ctx_t)0x0);
              prVar4 = gen_ctx_00->ra_ctx;
              pVVar13 = prVar4->spill_gaps;
              if ((pVVar13 == (VARR_lr_gap_t *)0x0) || (pVVar13->varr == (lr_gap_t *)0x0))
              goto LAB_0016ee3d;
              pVVar13->els_num = 0;
              cVar48 = auStack_160._8_4_ == MIR_T_P || (uint)auStack_160._8_4_ < MIR_T_F;
              auStack_160._4_4_ = 0xffffffff;
              pgVar41 = (gen_ctx_t)0x0;
              pcVar27 = (char *)0x0;
              do {
                if (pgVar41 < (gen_ctx_t)((long)pgVar46->ctx << 6)) {
                  if (auStack_160._8_4_ != MIR_T_LD) {
                    pgVar51 = (gen_ctx_t)pgVar46->curr_func_item;
                    in_R8 = (gen_ctx_t)(1L << ((ulong)pgVar41 & 0x3f) & (ulong)pgVar51->ctx);
                    if (in_R8 == (gen_ctx_t)0x0) goto LAB_0016ddc2;
                  }
                }
                else if (auStack_160._8_4_ != MIR_T_LD) {
LAB_0016ddc2:
                  bVar56 = pgVar41 < (gen_ctx_t)&DAT_00000010 != (bool)cVar48;
                  pgVar51 = (gen_ctx_t)CONCAT71((int7)((ulong)pgVar51 >> 8),bVar56);
                  if (!bVar56) {
                    uVar45 = (uint)pgVar41;
                    pgVar51 = (gen_ctx_t)(ulong)(uVar45 & 0x3e);
                    if ((0x20 < (uVar45 & 0x3e)) ||
                       (in_R8 = (gen_ctx_t)&DAT_101000410, (0x101000410U >> (long)pgVar51 & 1) == 0)
                       ) {
                      if (auStack_160._4_4_ == 0xffffffff) {
LAB_0016de30:
                        pcVar27 = (char *)gen_ctx_00->call_used_hard_regs[0x12];
                        if ((gen_ctx_t)pcVar27 == (gen_ctx_t)0x0) goto LAB_0016ee98;
                        pgVar51 = (gen_ctx_t)((long)((gen_ctx_t)pcVar27)->ctx << 6);
                        auStack_160._4_4_ = uVar45;
                        if (pgVar41 < pgVar51) {
                          pcVar27 = (char *)(ulong)(~(uint)((ulong)((gen_ctx_t)pcVar27)->
                                                                   curr_func_item->data >>
                                                           ((ulong)pgVar41 & 0x3f)) & 1);
                        }
                        else {
                          pcVar27 = &DAT_00000001;
                        }
                      }
                      else if ((int)pcVar27 == 0) {
                        pcVar27 = (char *)0x0;
                      }
                      else {
                        pgVar51 = (gen_ctx_t)gen_ctx_00->call_used_hard_regs[0x12];
                        if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016eea2;
                        in_R8 = (gen_ctx_t)((long)pgVar51->ctx << 6);
                        pcVar27 = &DAT_00000001;
                        if ((pgVar41 < in_R8) &&
                           (pgVar51 = (gen_ctx_t)
                                      ((DLIST_LINK_MIR_item_t *)&pgVar51->curr_func_item)->prev->
                                      data, ((ulong)pgVar51 >> ((ulong)pgVar41 & 0x3f) & 1) != 0))
                        goto LAB_0016de30;
                      }
                    }
                  }
                }
                pgVar41 = (gen_ctx_t)((long)&pgVar41->ctx + 1);
              } while (pgVar41 != (gen_ctx_t)0x22);
              if (auStack_160._4_4_ == 0xffffffff) {
                if ((uint)auStack_160._36_4_ < 2) {
LAB_0016e5f0:
                  in_R8 = (gen_ctx_t)auStack_160;
                  auStack_160._4_4_ =
                       get_stack_loc(gen_ctx_00,gen_ctx_00->ra_ctx->start_mem_loc,auStack_160._8_4_,
                                     (bitmap_t)pgVar46,(int *)in_R8);
                  goto LAB_0016e611;
                }
                if (prVar4->used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016eec5;
                if (prVar4->busy_used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016eeca;
                auStack_160._16_8_ = prVar4->used_locs->varr;
                pVStack_c0 = (bitmap_t)prVar4->busy_used_locs->varr;
                pFStack_98 = (FILE *)(ulong)(uint)(auStack_160._8_4_ << 0x10);
                pMStack_a0 = (MIR_item_t)(auStack_160._24_8_ << 0x20);
                pgVar41 = (gen_ctx_t)0x0;
                auStack_160._4_4_ = 0xffffffff;
                uStack_118 = 0;
                iStack_114 = 0;
                iStack_f0 = 0;
                auStack_160[0xf] = cVar48;
                MStack_ec = reg;
                do {
                  if (pgVar41 < (gen_ctx_t)&DAT_00000010 == (bool)cVar48 &&
                      auStack_160._8_4_ != MIR_T_LD) {
                    uVar45 = (uint)pgVar41;
                    if ((0x20 < (uVar45 & 0x3e)) || ((0x101000410U >> (uVar45 & 0x3e) & 1) == 0)) {
                      prVar4 = gen_ctx_00->ra_ctx;
                      pVVar13 = prVar4->curr_gaps;
                      if ((pVVar13 == (VARR_lr_gap_t *)0x0) || (pVVar13->varr == (lr_gap_t *)0x0))
                      goto LAB_0016ee7f;
                      pVVar13->els_num = 0;
                      pgStack_f8 = (gen_ctx_t)
                                   CONCAT44(pgStack_f8._4_4_,
                                            (int)prVar4->curr_reg_infos[auStack_160._24_8_].freq);
                      pVStack_100 = (bitmap_t)
                                    ((long)pgVar41->call_used_hard_regs +
                                    (long)&pMStack_a0->data + (long)&pFStack_98[-1]._fileno);
                      pgStack_120 = (gen_ctx_t)((ulong)pgStack_120 & 0xffffffff00000000);
                      bVar56 = true;
                      pgVar46 = pgStack_e8;
                      do {
                        pgVar51 = (gen_ctx_t)((ulong)pgVar41 & 0xffffffff);
                        pcVar27 = &DAT_00000001;
                        iVar25 = available_hreg_p(uVar45,1,(int)auStack_160._16_8_,
                                                  (bitmap_t *)pgVar46,(live_range_t_conflict)in_R8);
                        if (iVar25 == 0) {
                          pgVar51 = (gen_ctx_t)((ulong)pgVar41 & 0xffffffff);
                          pcVar27 = &DAT_00000001;
                          iVar25 = available_hreg_p(uVar45,1,(int)pVStack_c0,(bitmap_t *)pgVar46,
                                                    (live_range_t_conflict)in_R8);
                          if (iVar25 == 0) {
                            if ((gen_ctx *)pgVar46->ctx == (gen_ctx *)0x0) break;
                            pcVar27 = (char *)pgVar46;
                            iVar25 = gap_lr_spill_cost(gen_ctx_00,(live_range_t_conflict)pgVar46);
                            pVVar13 = gen_ctx_00->ra_ctx->curr_gaps;
                            pgVar51 = (gen_ctx_t)pVVar13->varr;
                            if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016ee33;
                            uVar28 = pVVar13->els_num + 1;
                            if (pVVar13->size < uVar28) {
                              sVar55 = (uVar28 >> 1) + uVar28;
                              pcVar27 = (char *)(sVar55 * 0x10);
                              plVar37 = (lr_gap_t *)realloc(pgVar51,(size_t)pcVar27);
                              pVVar13->varr = plVar37;
                              pVVar13->size = sVar55;
                            }
                            pgStack_f8 = (gen_ctx_t)
                                         CONCAT44(pgStack_f8._4_4_,(int)pgStack_f8 - iVar25);
                            sVar55 = pVVar13->els_num;
                            plVar37 = pVVar13->varr;
                            pVVar13->els_num = sVar55 + 1;
                            *(bitmap_t *)(plVar37 + sVar55) = pVStack_100;
                            plVar37[sVar55].lr = (live_range_t_conflict)pgVar46;
                          }
                          else {
                            pVVar13 = gen_ctx_00->ra_ctx->curr_gaps;
                            if (pVVar13 == (VARR_lr_gap_t *)0x0) goto LAB_0016ee06;
                            if (pVVar13->els_num == 0) {
                              pgStack_128 = (gen_ctx_t)0x0;
                            }
                            else {
                              if (pVVar13->varr == (lr_gap_t *)0x0) goto LAB_0016ee2e;
                              pgStack_128 = (gen_ctx_t)pVVar13->varr[pVVar13->els_num - 1].lr;
                            }
                            bVar56 = -1 < (long)(int)pgVar46->optimize_level;
                            if (bVar56) {
                              bVar56 = true;
                              uVar28 = (long)(int)pgVar46->optimize_level;
                              do {
                                pVVar38 = gen_ctx_00->ra_ctx->lr_gap_bitmaps[(long)pgVar41];
                                if (((pVVar38 != (bitmap_t)0x0) && (uVar28 < pVVar38->els_num << 6))
                                   && ((pVVar38->varr[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0)) {
                                  auStack_88._8_4_ = (undefined4)uVar28;
                                  pgVar51 = (gen_ctx_t)gen_ctx_00->ra_ctx->lr_gap_tab;
                                  in_R8 = (gen_ctx_t)auStack_b0;
                                  el.lr = (live_range_t_conflict)auStack_88;
                                  el._0_8_ = pgVar41;
                                  pcVar27 = (char *)pgVar41;
                                  iVar25 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar51,el,HTAB_FIND,
                                                            (lr_gap_t *)in_R8);
                                  if (iVar25 != 0) break;
                                }
                                bVar56 = 0 < (long)uVar28;
                                bVar17 = 0 < (long)uVar28;
                                uVar28 = uVar28 - 1;
                              } while (bVar17);
                            }
                            uVar22 = auStack_b0._8_8_;
                            uVar20 = auStack_b0._0_8_;
                            uVar44 = pgVar46->optimize_level;
                            pgVar53 = pgStack_128;
                            auStack_160._40_8_ = pVVar13;
                            if (bVar56) {
                              uVar54 = *(uint *)(auStack_b0._8_8_ + 0xc);
                              iVar25 = 0;
                              in_R8 = (gen_ctx_t)auStack_b0._8_8_;
                              if (((int)uVar44 <= (int)uVar54) &&
                                 (pgVar51 = pgStack_128, uVar44 = uVar54,
                                 pgStack_128 != (gen_ctx_t)auStack_b0._8_8_)) {
                                pgVar51 = (gen_ctx_t)pVVar13->varr;
                                if (pgVar51 == (gen_ctx_t)0x0) goto LAB_0016eea7;
                                uVar28 = pVVar13->els_num + 1;
                                if (pVVar13->size < uVar28) {
                                  sVar55 = (uVar28 >> 1) + uVar28;
                                  plVar37 = (lr_gap_t *)realloc(pgVar51,sVar55 * 0x10);
                                  *(lr_gap_t **)(auStack_160._40_8_ + 0x10) = plVar37;
                                  *(size_t *)(auStack_160._40_8_ + 8) = sVar55;
                                }
                                uVar21 = auStack_b0._0_8_;
                                sVar55 = *(size_t *)auStack_160._40_8_;
                                plVar14 = *(lr_gap_t **)(auStack_160._40_8_ + 0x10);
                                *(size_t *)auStack_160._40_8_ = sVar55 + 1;
                                plVar37 = plVar14 + sVar55;
                                auStack_b0._0_2_ = (undefined2)uVar20;
                                auStack_b0._2_2_ = SUB82(uVar20,2);
                                auStack_b0._4_4_ = SUB84(uVar20,4);
                                plVar37->hreg = auStack_b0._0_2_;
                                plVar37->type = auStack_b0._2_2_;
                                plVar37->reg = auStack_b0._4_4_;
                                plVar14[sVar55].lr = (live_range_t_conflict)uVar22;
                                pcVar27 = (char *)uVar22;
                                pgVar51 = gen_ctx_00;
                                in_R8 = (gen_ctx_t)uVar22;
                                auStack_b0._0_8_ = uVar21;
                                iVar25 = gap_lr_spill_cost(gen_ctx_00,(live_range_t_conflict)uVar22)
                                ;
                                pgVar53 = (gen_ctx_t)uVar22;
                              }
                            }
                            else {
                              iVar25 = 0;
                            }
                            while ((int)uVar44 < *(int *)&pgVar46->field_0xc) {
                              uVar44 = uVar44 + 1;
                              pVVar38 = gen_ctx_00->ra_ctx->lr_gap_bitmaps[(long)pgVar41];
                              if (pVVar38 != (bitmap_t)0x0) {
                                pgVar42 = (gen_ctx_t)(long)(int)uVar44;
                                pcVar27 = (char *)(pVVar38->els_num << 6);
                                if ((pgVar42 < pcVar27) &&
                                   (pcVar27 = (char *)((ulong)pgVar42 >> 6),
                                   (pVVar38->varr[(long)pcVar27] >> ((ulong)pgVar42 & 0x3f) & 1) !=
                                   0)) {
                                  pgVar51 = (gen_ctx_t)gen_ctx_00->ra_ctx->lr_gap_tab;
                                  in_R8 = (gen_ctx_t)auStack_b0;
                                  el_00.lr = (live_range_t_conflict)auStack_88;
                                  el_00._0_8_ = pgVar41;
                                  pcVar27 = (char *)pgVar41;
                                  auStack_88._8_4_ = uVar44;
                                  iVar26 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar51,el_00,HTAB_FIND
                                                            ,(lr_gap_t *)in_R8);
                                  uVar22 = auStack_b0._8_8_;
                                  uVar20 = auStack_160._40_8_;
                                  if (iVar26 != 0) {
                                    if (pgVar53 != (gen_ctx_t)auStack_b0._8_8_) {
                                      if (*(lr_gap_t **)(auStack_160._40_8_ + 0x10) ==
                                          (lr_gap_t *)0x0) goto LAB_0016ede8;
                                      uVar28 = *(size_t *)auStack_160._40_8_ + 1;
                                      pgVar51 = (gen_ctx_t)auStack_b0._0_8_;
                                      if (*(size_t *)(auStack_160._40_8_ + 8) < uVar28) {
                                        sVar55 = (uVar28 >> 1) + uVar28;
                                        pgStack_128 = (gen_ctx_t)auStack_b0._0_8_;
                                        plVar37 = (lr_gap_t *)
                                                  realloc(*(lr_gap_t **)(auStack_160._40_8_ + 0x10),
                                                          sVar55 * 0x10);
                                        *(lr_gap_t **)(uVar20 + 0x10) = plVar37;
                                        *(size_t *)(uVar20 + 8) = sVar55;
                                        pgVar51 = pgStack_128;
                                      }
                                      sVar55 = *(size_t *)uVar20;
                                      plVar37 = *(lr_gap_t **)(uVar20 + 0x10);
                                      *(size_t *)uVar20 = sVar55 + 1;
                                      *(gen_ctx_t *)(plVar37 + sVar55) = pgVar51;
                                      plVar37[sVar55].lr = (live_range_t_conflict)uVar22;
                                      pcVar27 = (char *)uVar22;
                                      pgVar51 = gen_ctx_00;
                                      iVar26 = gap_lr_spill_cost(gen_ctx_00,
                                                                 (live_range_t_conflict)uVar22);
                                      iVar25 = iVar25 + iVar26;
                                      pgVar53 = (gen_ctx_t)uVar22;
                                    }
                                    uVar44 = *(uint *)(uVar22 + 0xc);
                                  }
                                }
                              }
                            }
                            pgStack_f8 = (gen_ctx_t)
                                         CONCAT44(pgStack_f8._4_4_,(int)pgStack_f8 - iVar25);
                            pgStack_120 = (gen_ctx_t)
                                          CONCAT44(pgStack_120._4_4_,
                                                   (((int)pgStack_120 + *(int *)&pgVar46->field_0xc)
                                                   - pgVar46->optimize_level) + 1);
                          }
                        }
                        pgVar46 = (gen_ctx_t)pgVar46->debug_file;
                        bVar56 = pgVar46 != (gen_ctx_t)0x0;
                      } while (bVar56);
                      pgVar46 = pgStack_d0;
                      reg = MStack_ec;
                      cVar48 = auStack_160[0xf];
                      if (!bVar56) {
                        pgVar51 = (gen_ctx_t)((ulong)pgStack_f8 & 0xffffffff);
                        if (-1 < (int)pgStack_f8) {
                          pVVar38 = gen_ctx_00->call_used_hard_regs[0x12];
                          if (pVVar38 == (bitmap_t)0x0) goto LAB_0016eec0;
                          uVar44 = 0;
                          if (pgVar41 < (gen_ctx_t)(pVVar38->els_num << 6)) {
                            uVar44 = (uint)(*pVVar38->varr >> ((ulong)pgVar41 & 0x3f)) & 1;
                          }
                          if ((((auStack_160._4_4_ == 0xffffffff) || (iStack_114 < (int)pgStack_f8))
                              || (((int)pgStack_f8 == iStack_114 &&
                                  ((uStack_118 != 0 && (uVar44 != 0)))))) ||
                             (((int)pgStack_f8 == iStack_114 &&
                              ((uStack_118 == (uVar44 == 0) && (iStack_f0 < (int)pgStack_120)))))) {
                            uStack_118 = uVar44 ^ 1;
                            prVar4 = gen_ctx_00->ra_ctx;
                            pVVar13 = prVar4->spill_gaps;
                            pcVar27 = (char *)prVar4->curr_gaps;
                            prVar4->spill_gaps = (VARR_lr_gap_t *)pcVar27;
                            prVar4->curr_gaps = pVVar13;
                            iStack_f0 = (int)pgStack_120;
                            auStack_160._4_4_ = uVar45;
                            iStack_114 = (int)pgStack_f8;
                          }
                        }
                      }
                    }
                  }
                  pgVar41 = (gen_ctx_t)((long)&pgVar41->ctx + 1);
                } while (pgVar41 != (gen_ctx_t)0x22);
                if (auStack_160._4_4_ == 0xffffffff) goto LAB_0016e5f0;
                setup_used_hard_regs(gen_ctx_00,auStack_160._8_4_,auStack_160._4_4_);
                pcVar27 = "(with splitting live ranges)";
              }
              else {
                setup_used_hard_regs(gen_ctx_00,auStack_160._8_4_,auStack_160._4_4_);
LAB_0016e611:
                pcVar27 = "";
              }
              pFVar15 = (FILE *)gen_ctx_00->debug_file;
              if ((pFVar15 != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
                pcVar30 = MIR_reg_name(gen_ctx_00->ctx,reg,pMStack_110);
                in_stack_fffffffffffffe90 = (ulong)(uint)auStack_160._4_4_;
                in_R8 = pgStack_108;
                fprintf(pFVar15," Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar27,pcVar30,
                        pgStack_108,gen_ctx_00->ra_ctx->curr_reg_infos[auStack_160._24_8_].freq,
                        in_stack_fffffffffffffe90);
                fwrite("  live range: ",0xe,1,(FILE *)gen_ctx_00->debug_file);
                print_live_ranges(gen_ctx_00,(live_range_t_conflict)pgStack_e8);
              }
              if ((pVStack_c8 == (bitmap_t)0x0) || (pVStack_c8->varr == (bitmap_el_t *)0x0))
              goto LAB_0016ee38;
              pVStack_c8->els_num = 0;
              auStack_160._16_8_ = ZEXT48((uint)auStack_160._0_4_);
              while( true ) {
                pVVar13 = gen_ctx_00->ra_ctx->spill_gaps;
                if (pVVar13 == (VARR_lr_gap_t *)0x0) goto LAB_0016ed75;
                if (pVVar13->els_num == 0) break;
                plVar37 = pVVar13->varr;
                if (plVar37 == (lr_gap_t *)0x0) goto LAB_0016ed84;
                sVar55 = pVVar13->els_num - 1;
                pVVar13->els_num = sVar55;
                pVVar13 = *(VARR_lr_gap_t **)(plVar37 + sVar55);
                plVar36 = plVar37[sVar55].lr;
                if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (3 < gen_ctx_00->debug_level)
                   ) {
                  pcVar27 = "";
                  if ((int)((ulong)pVVar13 >> 0x20) == (int)pgStack_108) {
                    pcVar27 = "*";
                  }
                  in_R8 = (gen_ctx_t)(ulong)(uint)(int)(short)pVVar13;
                  in_stack_fffffffffffffe90 =
                       CONCAT44((int)(in_stack_fffffffffffffe90 >> 0x20),plVar36->finish);
                  fprintf((FILE *)gen_ctx_00->debug_file,
                          "   Splitting lr gap: r%d%s, h%d [%d..%d]\n",(ulong)pVVar13 >> 0x20,
                          pcVar27,in_R8,(ulong)(uint)plVar36->start,in_stack_fffffffffffffe90);
                }
                plVar50 = plVar36->lr_bb;
                auStack_160._40_8_ = pVVar13;
                if (plVar50 != (lr_bb_t_conflict)0x0) {
                  do {
                    pVVar38 = plVar50->bb->gen;
                    bitmap_expand(pVVar38,((ulong)pVVar13 >> 0x20) + 1);
                    if (pVVar38 == (bitmap_t)0x0) {
LAB_0016ed24:
                      assign_cold_41();
LAB_0016ed33:
                      __assert_fail("lr->lr_bb != ((void*)0)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c49,
                                    "void insert_lr_gap(gen_ctx_t, int, MIR_type_t, MIR_reg_t, live_range_t)"
                                   );
                    }
                    pVVar38->varr[(ulong)pVVar13 >> 0x26] =
                         pVVar38->varr[(ulong)pVVar13 >> 0x26] |
                         1L << ((ulong)pVVar13 >> 0x20 & 0x3f);
                    plVar50 = plVar50->next;
                  } while (plVar50 != (lr_bb_t)0x0);
                }
                pVVar38 = pVStack_c8;
                if (SUB84(auStack_160._40_8_,4) == (int)pgStack_108) {
                  uVar28 = (ulong)plVar36->start;
                  bitmap_expand(pVStack_c8,uVar28 + 1);
                  pVVar38->varr[uVar28 >> 6] = pVVar38->varr[uVar28 >> 6] | 1L << (uVar28 & 0x3f);
                }
                else {
                  sVar39 = (short)auStack_160._40_8_;
                  auStack_160._16_8_ =
                       ZEXT48((((uint)auStack_160._40_8_ & 0xffff0000) == 0xa0000 &&
                              0x21 < (uint)(int)sVar39) + 1);
                  pMVar43 = (MIR_item_t)0x0;
                  do {
                    if (plVar36->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_0016ecf7:
                      auStack_160._0_4_ = (undefined4)auStack_160._16_8_;
                      __assert_fail("lr->lr_bb != ((void*)0) && gen_ctx->ra_ctx->lr_gap_bitmaps[hreg] != ((void*)0)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c51,"void delete_lr_gap(gen_ctx_t, int, live_range_t)");
                    }
                    uVar45 = (int)sVar39 + (int)pMVar43;
                    prVar4 = gen_ctx_00->ra_ctx;
                    pVVar38 = prVar4->lr_gap_bitmaps[(int)uVar45];
                    if (pVVar38 == (bitmap_t)0x0) goto LAB_0016ecf7;
                    iVar25 = plVar36->start;
                    if ((ulong)(long)iVar25 < pVVar38->els_num << 6) {
                      bVar18 = (byte)iVar25 & 0x3f;
                      pVVar38->varr[(ulong)(long)iVar25 >> 6] =
                           pVVar38->varr[(ulong)(long)iVar25 >> 6] &
                           (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
                    }
                    el_01._0_4_ = uVar45 & 0xffff;
                    el_01.reg = 0;
                    el_01.lr = plVar36;
                    HTAB_lr_gap_t_do(prVar4->lr_gap_tab,el_01,HTAB_DELETE,(lr_gap_t *)auStack_88);
                    iVar25 = plVar36->start;
                    iVar26 = plVar36->finish;
                    in_R8 = (gen_ctx_t)(long)iVar25;
                    if (iVar25 <= iVar26) {
                      bVar18 = (byte)uVar45 & 0x3f;
                      in_R8 = (gen_ctx_t)0x0;
                      do {
                        pMVar16 = ((MIR_item_t_conflict *)(auStack_160._48_8_ + 0x68))
                                  [(long)((long)((gen_ctx_t)(long)iVar25)->call_used_hard_regs +
                                         (long)((long)&in_R8[-1].temp_insns2 + 3))];
                        if (pMVar16 == (MIR_item_t_conflict)0x0) goto LAB_0016ecba;
                        if ((ulong)uVar45 < (ulong)((long)pMVar16->data << 6)) {
                          ppvVar2 = &((pMVar16->item_link).prev)->data + (uVar45 >> 6);
                          *ppvVar2 = (void *)((ulong)*ppvVar2 &
                                             (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18))
                          ;
                        }
                        in_R8 = (gen_ctx_t)((long)&in_R8->ctx + 1);
                      } while ((iVar26 - iVar25) + 1 != (int)in_R8);
                    }
                    pMVar43 = (MIR_item_t)((long)&pMVar43->data + 1);
                  } while (pMVar43 != (MIR_item_t)auStack_160._16_8_);
                }
              }
              auStack_160._0_4_ = (undefined4)auStack_160._16_8_;
              pVVar3 = gen_ctx_00->ra_ctx->reg_renumber;
              if (((pVVar3 == (VARR_MIR_reg_t *)0x0) || (pVVar3->varr == (MIR_reg_t *)0x0)) ||
                 ((FILE *)pVVar3->els_num <= (ulong)auStack_160._24_8_)) goto LAB_0016ee1a;
              pVStack_100 = (bitmap_t)CONCAT71(pVStack_100._1_7_,(uint)auStack_160._36_4_ < 2);
              pVVar3->varr[auStack_160._24_8_] = auStack_160._4_4_;
              auStack_160._0_4_ =
                   (auStack_160._8_4_ == MIR_T_LD && 0x21 < (uint)auStack_160._4_4_) + 1;
              pVVar12 = gen_ctx_00->lr_ctx->var_live_ranges;
              if (((pVVar12 == (VARR_live_range_t *)0x0) ||
                  (pVVar12->varr == (live_range_t_conflict *)0x0)) ||
                 ((FILE *)pVVar12->els_num <= (ulong)auStack_160._24_8_)) goto LAB_0016ee15;
              pMVar43 = (MIR_item_t)pVVar12->varr[auStack_160._24_8_];
              if (pMVar43 != (MIR_item_t)0x0) {
                pVStack_100 = (bitmap_t)
                              CONCAT71(pVStack_100._1_7_,
                                       (uint)auStack_160._36_4_ < 2 ||
                                       0x21 < (uint)auStack_160._4_4_);
                auStack_160._24_8_ = auStack_160._24_8_ << 0x20;
                auStack_160._8_4_ = auStack_160._8_4_ << 0x10;
                pVStack_c0 = (bitmap_t)(ulong)(uint)auStack_160._4_4_;
                pgStack_120 = (gen_ctx_t)(ulong)(uint)auStack_160._0_4_;
                pgStack_e8 = (gen_ctx_t)((long)pVStack_c0 << 0x20);
                do {
                  uVar20 = auStack_160._48_8_;
                  uVar45 = 1;
                  auStack_160._16_8_ = pMVar43;
                  if ((char)pVStack_100 == '\0') {
                    uVar28 = (ulong)*(int *)&pMVar43->module;
                    uVar44 = 0;
                    if (uVar28 < pVStack_c8->els_num << 6) {
                      uVar44 = (uint)(pVStack_c8->varr[uVar28 >> 6] >> (uVar28 & 0x3f)) & 1;
                    }
                    uVar45 = uVar44 ^ 1;
                    if (uVar44 == 0) goto LAB_0016ea1d;
                  }
                  else {
LAB_0016ea1d:
                    lVar52 = (long)*(int *)&pMVar43->module;
                    pgVar51 = pgStack_120;
                    uVar44 = auStack_160._4_4_;
                    if (*(int *)&pMVar43->module <= *(int *)((long)&pMVar43->module + 4)) {
                      do {
                        pMVar16 = ((MIR_item_t_conflict *)(uVar20 + 0x68))[lVar52 + -0xd];
                        bitmap_expand((bitmap_t)pMVar16,(ulong)uVar44 + 1);
                        if (pMVar16 == (MIR_item_t_conflict)0x0) {
                          assign_cold_44();
LAB_0016ecba:
                          assign_cold_42();
LAB_0016ecc9:
                          assign_cold_26();
LAB_0016ecce:
                          assign_cold_25();
                          goto LAB_0016ecd3;
                        }
                        ppvVar2 = &((pMVar16->item_link).prev)->data + (uVar44 >> 6);
                        *ppvVar2 = (void *)((ulong)*ppvVar2 | 1L << ((ulong)uVar44 & 0x3f));
                        pgVar51 = (gen_ctx_t)((long)&pgVar51[-1].spot_attrs + 7);
                        uVar44 = uVar44 + 1;
                      } while ((pgVar51 != (gen_ctx_t)0x0) ||
                              (bVar56 = lVar52 < *(int *)((long)(auStack_160._16_8_ + 8) + 4),
                              pgVar51 = pgStack_120, uVar44 = auStack_160._4_4_, lVar52 = lVar52 + 1
                              , bVar56));
                    }
                  }
                  pMVar43 = (MIR_item_t)auStack_160._16_8_;
                  if ((char)pVStack_100 == '\0') {
                    if ((bitmap_t)*(lr_bb_t_conflict *)auStack_160._16_8_ == (bitmap_t)0x0) {
                      pgVar51 = pgStack_120;
                      pVVar38 = pVStack_c0;
                      lVar52 = (long)*(int *)(auStack_160._16_8_ + 8);
                      if (*(int *)(auStack_160._16_8_ + 8) <=
                          *(int *)((long)(auStack_160._16_8_ + 8) + 4)) {
                        do {
                          bm_00 = (bitmap_t)(&pVStack_d8->els_num)[lVar52];
                          nb = (bitmap_t)((long)&pVVar38->els_num + 1);
                          bitmap_expand(bm_00,(size_t)nb);
                          if (bm_00 == (bitmap_t)0x0) {
LAB_0016ecd3:
                            assign_cold_46();
LAB_0016ecd8:
                            __assert_fail("bitmap_bit_p (used_locs_addr[j], hard_reg)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1db1,"void assign(gen_ctx_t)");
                          }
                          bm_00->varr[(ulong)pVVar38 >> 6] =
                               bm_00->varr[(ulong)pVVar38 >> 6] | 1L << ((ulong)pVVar38 & 0x3f);
                          pgVar51 = (gen_ctx_t)((long)&pgVar51[-1].spot_attrs + 7);
                          pVVar38 = nb;
                        } while ((pgVar51 != (gen_ctx_t)0x0) ||
                                (bVar56 = lVar52 < *(int *)((long)(auStack_160._16_8_ + 8) + 4),
                                pMVar43 = (MIR_item_t)auStack_160._16_8_, pgVar51 = pgStack_120,
                                pVVar38 = pVStack_c0, lVar52 = lVar52 + 1, bVar56));
                      }
                    }
                    else if (uVar45 != 0) {
                      auStack_160._40_4_ = auStack_160._4_4_;
                      pgVar51 = pgStack_120;
                      pgVar46 = pgStack_e8;
                      do {
                        if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) &&
                           (3 < gen_ctx_00->debug_level)) {
                          fprintf((FILE *)gen_ctx_00->debug_file,
                                  "    Adding lr gap: r%d, h%d [%d..%d]\n",pgStack_108,
                                  auStack_160._40_8_ & 0xffffffff,(ulong)*(uint *)&pMVar43->module,
                                  (ulong)(uint)*(int *)((long)&pMVar43->module + 4));
                        }
                        if ((bitmap_t)pMVar43->data == (bitmap_t)0x0) goto LAB_0016ed33;
                        prVar4 = gen_ctx_00->ra_ctx;
                        pgStack_128 = pgVar51;
                        pgStack_f8 = pgVar46;
                        if (*(long *)((long)prVar4->lr_gap_bitmaps + ((long)pgVar46 >> 0x1d)) == 0)
                        {
                          uVar45 = (*(int *)(auStack_160._16_8_ + 8) * 3) / 2 + 0x3f;
                          sVar55 = (ulong)(long)(int)uVar45 >> 6;
                          pVVar38 = (bitmap_t)malloc(0x18);
                          if (uVar45 < 0x40) {
                            sVar55 = 0x40;
                          }
                          pVVar38->els_num = 0;
                          pVVar38->size = sVar55;
                          pbVar33 = (bitmap_el_t *)malloc(sVar55 << 3);
                          pVVar38->varr = pbVar33;
                          prVar4->lr_gap_bitmaps[(long)pgVar46 >> 0x20] = pVVar38;
                        }
                        pMVar43 = (MIR_item_t)auStack_160._16_8_;
                        pVVar38 = gen_ctx_00->ra_ctx->lr_gap_bitmaps[(long)pgVar46 >> 0x20];
                        uVar28 = (ulong)*(int *)(auStack_160._16_8_ + 8);
                        bitmap_expand(pVVar38,uVar28 + 1);
                        pgVar51 = pgStack_128;
                        if (pVVar38 == (bitmap_t)0x0) {
                          assign_cold_45();
                          goto LAB_0016ed57;
                        }
                        uVar19 = auStack_160._40_4_;
                        el_02._0_8_ = (ulong)(auStack_160._40_4_ & 0xffff | auStack_160._8_4_) |
                                      auStack_160._24_8_;
                        pVVar38->varr[uVar28 >> 6] =
                             pVVar38->varr[uVar28 >> 6] | 1L << (uVar28 & 0x3f);
                        in_R8 = (gen_ctx_t)auStack_88;
                        el_02.lr = (live_range_t_conflict)pMVar43;
                        HTAB_lr_gap_t_do(gen_ctx_00->ra_ctx->lr_gap_tab,el_02,HTAB_INSERT,
                                         (lr_gap_t *)in_R8);
                        pgVar46 = pgStack_f8 + 0x800000;
                        auStack_160._40_4_ = uVar19 + MIR_T_U8;
                        pgVar51 = (gen_ctx_t)((long)&pgVar51[-1].spot_attrs + 7);
                      } while (pgVar51 != (gen_ctx_t)0x0);
                    }
                  }
                  pMVar43 = (pMVar43->item_link).next;
                } while (pMVar43 != (MIR_item_t)0x0);
              }
            }
          }
          else {
            pcVar27 = MIR_reg_hard_reg_name((MIR_context_t)pgStack_90,reg,pMStack_110);
            uVar45 = _MIR_get_hard_reg((MIR_context_t)pgVar41,pcVar27);
            if (0x21 < uVar45) goto LAB_0016ee56;
            pVVar3 = gen_ctx_00->ra_ctx->reg_renumber;
            if (((pVVar3 == (VARR_MIR_reg_t *)0x0) || (pVVar3->varr == (MIR_reg_t *)0x0)) ||
               ((FILE *)pVVar3->els_num <= (ulong)auStack_160._24_8_)) goto LAB_0016edf7;
            pVVar3->varr[auStack_160._24_8_] = uVar45;
            pVVar12 = gen_ctx_00->lr_ctx->var_live_ranges;
            if (((pVVar12 == (VARR_live_range_t *)0x0) ||
                (pVVar12->varr == (live_range_t_conflict *)0x0)) ||
               ((FILE *)pVVar12->els_num <= (ulong)auStack_160._24_8_)) goto LAB_0016eded;
            plVar36 = pVVar12->varr[auStack_160._24_8_];
            if (plVar36 != (live_range_t_conflict)0x0) {
              do {
                iVar25 = plVar36->start;
                in_R8 = (gen_ctx_t)(long)iVar25;
                if (iVar25 <= plVar36->finish) {
                  in_R8 = (gen_ctx_t)0x0;
                  do {
                    pMVar16 = ((MIR_item_t_conflict *)(auStack_160._48_8_ + 0x68))
                              [(long)((long)((gen_ctx_t)(long)iVar25)->call_used_hard_regs +
                                     (long)((long)&in_R8[-1].temp_insns2 + 3))];
                    if (pMVar16 == (MIR_item_t_conflict)0x0) {
                      assign_cold_27();
                      goto LAB_0016ed24;
                    }
                    if (((ulong)((long)pMVar16->data << 6) <= (ulong)uVar45) ||
                       (((ulong)((pMVar16->item_link).prev)->data & 1L << ((ulong)uVar45 & 0x3f)) ==
                        0)) goto LAB_0016ecd8;
                    in_R8 = (gen_ctx_t)((long)&in_R8->ctx + 1);
                  } while ((plVar36->finish - iVar25) + 1 != (int)in_R8);
                }
                plVar36 = plVar36->next;
              } while (plVar36 != (live_range_t)0x0);
            }
            if (pcVar27 == (char *)0x0) {
              setup_used_hard_regs(gen_ctx_00,auStack_160._8_4_,uVar45);
            }
            pFVar15 = (FILE *)gen_ctx_00->debug_file;
            if ((pFVar15 != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
              pcVar27 = MIR_reg_name(gen_ctx_00->ctx,reg,pMStack_110);
              in_R8 = (gen_ctx_t)gen_ctx_00->ra_ctx->curr_reg_infos[auStack_160._24_8_].freq;
              fprintf(pFVar15," Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar27,
                      pgStack_108,in_R8,(ulong)uVar45);
            }
          }
        }
        pVVar38 = (bitmap_t)((long)&pVStack_b8->els_num + 1);
      } while (pVVar38 != pVStack_e0);
    }
    return;
  }
LAB_0016ee8e:
  assign_cold_57();
LAB_0016ee93:
  assign_cold_22();
LAB_0016ee98:
  assign_cold_31();
LAB_0016ee9d:
  assign_cold_8();
LAB_0016eea2:
  assign_cold_30();
LAB_0016eea7:
  assign_cold_33();
LAB_0016eeac:
  assign_cold_66();
LAB_0016eeb1:
  assign_cold_61();
LAB_0016eeb6:
  assign_cold_60();
LAB_0016eebb:
  assign_cold_59();
LAB_0016eec0:
  assign_cold_37();
LAB_0016eec5:
  assign_cold_40();
LAB_0016eeca:
  assign_cold_39();
  output_bitmap(pgVar51,"  live_in:",(bitmap_t)((gen_ctx_t)pcVar27)->call_used_hard_regs[0],1,
                (MIR_reg_t *)0x0);
  output_bitmap(pgVar51,"  live_out:",((gen_ctx_t)pcVar27)->call_used_hard_regs[1],1,
                (MIR_reg_t *)0x0);
  output_bitmap(pgVar51,"  spill_gen:",((gen_ctx_t)pcVar27)->call_used_hard_regs[2],1,
                (MIR_reg_t *)0x0);
  output_bitmap(pgVar51,"  spill_kill:",((gen_ctx_t)pcVar27)->call_used_hard_regs[3],1,
                (MIR_reg_t *)0x0);
  return;
LAB_0016ed57:
  assign_cold_19();
LAB_0016ed5c:
  assign_cold_58();
LAB_0016ed61:
  assign_cold_21();
LAB_0016ed66:
  assign_cold_56();
LAB_0016ed6b:
  assign_cold_55();
LAB_0016ed70:
  assign_cold_12();
LAB_0016ed75:
  assign_cold_49();
LAB_0016ed84:
  assign_cold_43();
LAB_0016ed93:
  assign_cold_2();
LAB_0016ed9f:
  assign_cold_64();
LAB_0016eda4:
  assign_cold_9();
LAB_0016eda9:
  assign_cold_54();
LAB_0016edae:
  assign_cold_62();
LAB_0016edb3:
  assign_cold_5();
LAB_0016edbf:
  assign_cold_4();
LAB_0016edcb:
  assign_cold_24();
LAB_0016edd0:
  assign_cold_1();
LAB_0016eddc:
  assign_cold_3();
LAB_0016ede8:
  assign_cold_34();
LAB_0016eded:
  assign_cold_28();
LAB_0016edf2:
  assign_cold_53();
LAB_0016edf7:
  assign_cold_29();
LAB_0016edfc:
  assign_cold_18();
LAB_0016ee01:
  assign_cold_11();
LAB_0016ee06:
  assign_cold_35();
LAB_0016ee0b:
  assign_cold_23();
LAB_0016ee10:
  assign_cold_17();
LAB_0016ee15:
  assign_cold_47();
LAB_0016ee1a:
  assign_cold_48();
LAB_0016ee1f:
  assign_cold_13();
LAB_0016ee24:
  assign_cold_6();
LAB_0016ee29:
  assign_cold_16();
LAB_0016ee2e:
  assign_cold_32();
LAB_0016ee33:
  assign_cold_36();
LAB_0016ee38:
  assign_cold_50();
LAB_0016ee3d:
  assign_cold_51();
LAB_0016ee42:
  assign_cold_52();
LAB_0016ee47:
  assign_cold_20();
LAB_0016ee4c:
  assign_cold_15();
LAB_0016ee51:
  assign_cold_14();
LAB_0016ee56:
  __assert_fail("hard_reg >= 0 && hard_reg <= ST1_HARD_REG && target_locs_num (hard_reg, type) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1dac,"void assign(gen_ctx_t)");
}

Assistant:

static void update_bitmap_after_coalescing (gen_ctx_t gen_ctx, bitmap_t bm) {
  MIR_reg_t reg, first_reg;
  size_t nel;
  bitmap_iterator_t bi;

  FOREACH_BITMAP_BIT (bi, bm, nel) {
    reg = (MIR_reg_t) nel;
    if (reg <= MAX_HARD_REG) continue;
    if ((first_reg = VARR_GET (MIR_reg_t, first_coalesced_reg, reg)) == reg) continue;
    bitmap_clear_bit_p (bm, reg);
    bitmap_set_bit_p (bm, first_reg);
  }
}